

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O1

void __thiscall
so_5::disp::active_group::impl::real_private_dispatcher_t::~real_private_dispatcher_t
          (real_private_dispatcher_t *this)

{
  proxy_dispatcher_t *ppVar1;
  
  (this->super_private_dispatcher_t)._vptr_private_dispatcher_t =
       (_func_int **)&PTR__real_private_dispatcher_t_0028d770;
  ppVar1 = (this->m_disp)._M_t.
           super___uniq_ptr_impl<so_5::disp::active_group::impl::proxy_dispatcher_t,_std::default_delete<so_5::disp::active_group::impl::proxy_dispatcher_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_so_5::disp::active_group::impl::proxy_dispatcher_t_*,_std::default_delete<so_5::disp::active_group::impl::proxy_dispatcher_t>_>
           .super__Head_base<0UL,_so_5::disp::active_group::impl::proxy_dispatcher_t_*,_false>.
           _M_head_impl;
  (**(code **)(*(long *)&(ppVar1->super_proxy_dispatcher_base_t).super_actual_disp_iface_t + 0x18))
            (ppVar1);
  (**(code **)(*(long *)&(ppVar1->super_proxy_dispatcher_base_t).super_actual_disp_iface_t + 0x20))
            (ppVar1);
  ppVar1 = (this->m_disp)._M_t.
           super___uniq_ptr_impl<so_5::disp::active_group::impl::proxy_dispatcher_t,_std::default_delete<so_5::disp::active_group::impl::proxy_dispatcher_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_so_5::disp::active_group::impl::proxy_dispatcher_t_*,_std::default_delete<so_5::disp::active_group::impl::proxy_dispatcher_t>_>
           .super__Head_base<0UL,_so_5::disp::active_group::impl::proxy_dispatcher_t_*,_false>.
           _M_head_impl;
  if (ppVar1 != (proxy_dispatcher_t *)0x0) {
    (**(code **)(*(long *)&(ppVar1->super_proxy_dispatcher_base_t).super_actual_disp_iface_t + 8))()
    ;
  }
  (this->m_disp)._M_t.
  super___uniq_ptr_impl<so_5::disp::active_group::impl::proxy_dispatcher_t,_std::default_delete<so_5::disp::active_group::impl::proxy_dispatcher_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_so_5::disp::active_group::impl::proxy_dispatcher_t_*,_std::default_delete<so_5::disp::active_group::impl::proxy_dispatcher_t>_>
  .super__Head_base<0UL,_so_5::disp::active_group::impl::proxy_dispatcher_t_*,_false>._M_head_impl =
       (proxy_dispatcher_t *)0x0;
  atomic_refcounted_t::~atomic_refcounted_t
            (&(this->super_private_dispatcher_t).super_atomic_refcounted_t);
  return;
}

Assistant:

~real_private_dispatcher_t()
			{
				shutdown_and_wait( *m_disp );
			}